

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall
leveldb::DBTest_CustomComparator_Test::TestBody()::NumberComparator::FindShortestSeparator(std::
__cxx11::string*,leveldb::Slice_const___const(void *this,string *s,Slice *l)

{
  Slice local_18;
  
  local_18.data_ = (s->_M_dataplus)._M_p;
  local_18.size_ = s->_M_string_length;
  ToNumber(leveldb::Slice_const__(&local_18);
  ToNumber(leveldb::Slice_const__(l);
  return;
}

Assistant:

void FindShortestSeparator(std::string* s, const Slice& l) const override {
      ToNumber(*s);  // Check format
      ToNumber(l);   // Check format
    }